

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# manipulation.h
# Opt level: O2

RefNull * wasm::ExpressionManipulator::refNull<wasm::RefFunc>(RefFunc *target,HeapType type)

{
  BasicHeapType BVar1;
  RefNull *output;
  HeapType heapType;
  HeapType local_28;
  HeapType type_local;
  
  (target->super_SpecificExpression<(wasm::Expression::Id)43>).super_Expression._id = RefNullId;
  (target->super_SpecificExpression<(wasm::Expression::Id)43>).super_Expression.type.id = 0;
  local_28.id = type.id;
  BVar1 = HeapType::getBottom(&local_28);
  heapType.id._4_4_ = 0;
  heapType.id._0_4_ = BVar1;
  Type::Type((Type *)&type_local,heapType,Nullable,Inexact);
  wasm::RefNull::finalize((Type)target);
  return (RefNull *)target;
}

Assistant:

inline RefNull* refNull(InputType* target, HeapType type) {
  auto* ret = convert<InputType, RefNull>(target);
  ret->finalize(Type(type.getBottom(), Nullable));
  return ret;
}